

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

obj * splitobj(obj *obj,long num)

{
  uint uVar1;
  uint uVar2;
  boolean bVar3;
  uint uVar4;
  obj *obj_00;
  long lVar5;
  obj *poVar6;
  obj *poVar7;
  size_t __n;
  byte bVar8;
  
  bVar8 = 0;
  if (((0 < num) && (obj->cobj == (obj *)0x0)) && (num < obj->quan)) {
    obj_00 = (obj *)malloc((ulong)((uint)obj->onamelth + (int)obj->oxlth) + 0x68);
    poVar6 = obj;
    poVar7 = obj_00;
    for (lVar5 = 0xd; uVar4 = flags.ident, lVar5 != 0; lVar5 = lVar5 + -1) {
      poVar7->nobj = poVar6->nobj;
      poVar6 = (obj *)((long)poVar6 + (ulong)bVar8 * -0x10 + 8);
      poVar7 = (obj *)((long)poVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    uVar1 = flags.ident + 1;
    uVar2 = uVar1;
    obj_00->o_id = flags.ident;
    flags.ident = uVar2;
    if (uVar4 == 0) {
      flags.ident = 2;
      obj_00->o_id = uVar1;
    }
    obj_00->timed = '\0';
    obj_00->field_0x4c = obj_00->field_0x4c & 0xf7;
    obj_00->owornmask = 0;
    obj->quan = obj->quan - (int)num;
    uVar4 = weight(obj);
    obj->owt = uVar4;
    obj_00->quan = (int)num;
    uVar4 = weight(obj_00);
    obj_00->owt = uVar4;
    obj->nobj = obj_00;
    if (obj->where == '\x01') {
      (obj->v).v_nexthere = obj_00;
    }
    __n = (size_t)obj->oxlth;
    if (__n != 0) {
      memcpy(obj_00->oextra,obj->oextra,__n);
    }
    if ((ulong)obj->onamelth != 0) {
      strncpy((char *)((long)obj_00->oextra + (long)obj_00->oxlth),(char *)((long)obj->oextra + __n)
              ,(ulong)obj->onamelth);
    }
    if ((obj->field_0x4a & 4) != 0) {
      splitbill(obj,obj_00);
    }
    if (obj->timed != '\0') {
      obj_split_timers(obj,obj_00);
    }
    bVar3 = obj_sheds_light(obj);
    if (bVar3 != '\0') {
      obj_split_light_source(obj,obj_00);
    }
    return obj_00;
  }
  panic("splitobj");
}

Assistant:

struct obj *splitobj(struct obj *obj, long num)
{
	struct obj *otmp;

	if (obj->cobj || num <= 0L || obj->quan <= num)
	    panic("splitobj");	/* can't split containers */
	otmp = newobj(obj->oxlth + obj->onamelth);
	*otmp = *obj;		/* copies whole structure */
	otmp->o_id = flags.ident++;
	if (!otmp->o_id) otmp->o_id = flags.ident++;	/* ident overflowed */
	otmp->timed = 0;	/* not timed, yet */
	otmp->lamplit = 0;	/* ditto */
	otmp->owornmask = 0L;	/* new object isn't worn */
	obj->quan -= num;
	obj->owt = weight(obj);
	otmp->quan = num;
	otmp->owt = weight(otmp);	/* -= obj->owt ? */
	obj->nobj = otmp;
	/* Only set nexthere when on the floor, nexthere is also used */
	/* as a back pointer to the container object when contained. */
	if (obj->where == OBJ_FLOOR)
	    obj->nexthere = otmp;
	if (obj->oxlth)
	    memcpy(otmp->oextra, (void *)obj->oextra,
			obj->oxlth);
	if (obj->onamelth)
	    strncpy(ONAME(otmp), ONAME(obj), (int)obj->onamelth);
	if (obj->unpaid) splitbill(obj,otmp);
	if (obj->timed) obj_split_timers(obj, otmp);
	if (obj_sheds_light(obj)) obj_split_light_source(obj, otmp);
	return otmp;
}